

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::text_format_unittest::AbslStringifyTest_StringifyDirectMessageEnumIsRedacted_Test
::~AbslStringifyTest_StringifyDirectMessageEnumIsRedacted_Test
          (AbslStringifyTest_StringifyDirectMessageEnumIsRedacted_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AbslStringifyTest, StringifyDirectMessageEnumIsRedacted) {
  unittest::TestRedactedMessage proto;
  proto.set_test_direct_message_enum("foo");
  EXPECT_THAT(absl::StrCat(proto), testing::MatchesRegex(absl::Substitute(
                                       "$0\n"
                                       "test_direct_message_enum: $1\n",
                                       kTextMarkerRegex, value_replacement)));
}